

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetCompileOptionsCommand.cxx
# Opt level: O2

bool __thiscall
cmTargetCompileOptionsCommand::HandleDirectContent
          (cmTargetCompileOptionsCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool param_3,bool param_4)

{
  cmListFileBacktrace lfbt;
  cmValueWithOrigin entry;
  string sStack_b8;
  cmListFileBacktrace local_98;
  cmValueWithOrigin local_68;
  
  cmMakefile::GetBacktrace(&local_98,(this->super_cmTargetPropCommandBase).super_cmCommand.Makefile)
  ;
  (*(this->super_cmTargetPropCommandBase).super_cmCommand.super_cmObject._vptr_cmObject[0x11])
            (&sStack_b8,this,content);
  cmValueWithOrigin::cmValueWithOrigin(&local_68,&sStack_b8,&local_98);
  std::__cxx11::string::~string((string *)&sStack_b8);
  cmTarget::InsertCompileOption(tgt,&local_68,false);
  cmValueWithOrigin::~cmValueWithOrigin(&local_68);
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
            (&local_98.super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  return true;
}

Assistant:

bool cmTargetCompileOptionsCommand
::HandleDirectContent(cmTarget *tgt, const std::vector<std::string> &content,
                                   bool, bool)
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  cmValueWithOrigin entry(this->Join(content), lfbt);
  tgt->InsertCompileOption(entry);
  return true;
}